

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O2

void helics::detail::convertFromBinary(byte *data,vector<double,_std::allocator<double>_> *val)

{
  pointer pdVar1;
  size_t __new_size;
  double *element;
  pointer data_00;
  
  __new_size = getDataSize(data);
  std::vector<double,_std::allocator<double>_>::resize(val,__new_size);
  if (__new_size != 0) {
    memcpy((val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start,data + 8,__new_size << 3);
  }
  if ((*data & 1) != 0) {
    pdVar1 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (data_00 = (val->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start; data_00 != pdVar1; data_00 = data_00 + 1) {
      checks::swapBytes<8ul>((byte *)data_00);
    }
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, std::vector<double>& val)
{
    const std::size_t size = getDataSize(data);
    val.resize(size);
    if (size > 0) {
        std::memcpy(val.data(), data + 8, size * sizeof(double));
    }
    if ((data[0] & endianMask) != littleEndianCode) {
        for (auto& element : val) {
            checks::swapBytes<8>(reinterpret_cast<std::byte*>(&element));
        }
    }
}